

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase_tests.cpp
# Opt level: O3

void __thiscall netbase_tests::caddress_serialize_v2::test_method(caddress_serialize_v2 *this)

{
  int iVar1;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  Span<const_unsigned_char> s;
  const_string msg;
  lazy_ostream local_138;
  undefined1 *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  DataStream local_f8;
  undefined **local_d0;
  undefined **local_c8;
  undefined1 local_c0;
  undefined1 *local_b8;
  undefined ***local_b0;
  string *local_a8;
  ParamsStream<DataStream_&,_CAddress::SerParams> local_a0;
  undefined1 *local_90;
  string **local_88;
  char *local_80;
  char *local_78;
  assertion_result local_70;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a0.m_substream = &local_f8;
  local_f8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.m_read_pos = 0;
  local_f8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0.m_params = &CAddress::V2_NETWORK;
  VectorFormatter<DefaultFormatter>::
  Ser<ParamsStream<DataStream&,CAddress::SerParams>,std::vector<CAddress,std::allocator<CAddress>>>
            ((VectorFormatter<DefaultFormatter> *)&local_c8,&local_a0,
             (vector<CAddress,_std::allocator<CAddress>_> *)&fixture_addresses);
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x248;
  file.m_begin = (iterator)&local_108;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_118,msg);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  s.m_data = local_f8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start + local_f8.m_read_pos;
  s.m_size = (long)local_f8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)s.m_data;
  HexStr_abi_cxx11_(&local_58,s);
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,
                     "0361bc6649000210000000000000000000000000000000010000796276830102100000000000000000000000000000000100f1fffffffffd4804021000000000000000000000000000000001f1f2"
                    );
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_78 = "";
  local_88 = &local_a8;
  local_a0.m_substream = (DataStream *)((ulong)local_a0.m_substream & 0xffffffffffffff00);
  local_a0.m_params = (SerParams *)&PTR__lazy_ostream_013ae148;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_d0;
  local_d0 = &stream_addrv2_hex;
  local_c0 = 0;
  local_c8 = &PTR__lazy_ostream_013ae658;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_58;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_138,1,2,REQUIRE,0xeb9736,(size_t)&local_80,0x248,&local_a0,
             "stream_addrv2_hex",(VectorFormatter<DefaultFormatter> *)&local_c8);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_f8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(caddress_serialize_v2)
{
    DataStream s{};

    s << CAddress::V2_NETWORK(fixture_addresses);
    BOOST_CHECK_EQUAL(HexStr(s), stream_addrv2_hex);
}